

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

ON_Color __thiscall ON_Layer::PerViewportPlotColor(ON_Layer *this,ON_UUID viewport_id)

{
  uint uVar1;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar2;
  ON__LayerPerViewSettings *pOVar3;
  bool in_R9B;
  ON_UUID viewport_id_00;
  
  if ((this->m_extension_bits & 1) == 0) {
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00._0_8_ = viewport_id.Data4;
    pOVar3 = ON__LayerExtensions::ViewportSettings
                       ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                        viewport_id._0_8_,viewport_id_00,in_R9B);
    if (pOVar3 != (ON__LayerPerViewSettings *)0x0) {
      uVar1 = ON_Color::operator_cast_to_unsigned_int(&pOVar3->m_plot_color);
      if (uVar1 != 0xffffffff) {
        return (ON_Color)(pOVar3->m_plot_color).field_0;
      }
    }
  }
  aVar2 = (anon_union_4_2_6147a14e_for_ON_Color_15)PlotColor(this);
  return (ON_Color)aVar2;
}

Assistant:

ON_Color ON_Layer::PerViewportPlotColor( ON_UUID viewport_id ) const
{
  if ( !ExtensionBit(m_extension_bits,0x01) )
  {
    const ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
    if ( 0 != vp_settings && vp_settings->m_plot_color != ON_UNSET_COLOR )
      return vp_settings->m_plot_color;
  }

  // no per viewport settings
  // 2-Nov-2009 Dale Fugier, modified to call default PlotColor()
  return PlotColor();
}